

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_unittest.cpp
# Opt level: O0

void __thiscall
Array_new_array_by_ref_Test::~Array_new_array_by_ref_Test(Array_new_array_by_ref_Test *this)

{
  Array_new_array_by_ref_Test *this_local;
  
  ~Array_new_array_by_ref_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Array,new_array_by_ref) {
    using namespace memory;

    typedef Array<double, HostCoordinator<double> > by_value;
    typedef ArrayView<double, HostCoordinator<double> > by_reference;

    // create range by value of length 10
    // this should allocate memory of length 10*sizeof(T)
    by_value v1(10);
    by_reference r1(v1);

    EXPECT_EQ(r1.size(), v1.size());
    EXPECT_EQ(r1.data(), v1.data());
    by_value v2(r1);
    EXPECT_EQ(v2.size(), v1.size());
    EXPECT_NE(v2.data(), v1.data());
}